

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void edition_unittest::TestNestedMessageHasBits::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *failure_msg;
  void *pvVar2;
  int line;
  Arena *arena;
  TestNestedMessageHasBits *_this;
  TestNestedMessageHasBits *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestNestedMessageHasBits *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<edition_unittest::TestNestedMessageHasBits_const*,edition_unittest::TestNestedMessageHasBits*>
                          ((TestNestedMessageHasBits **)local_28,&local_30,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 1) != 0) {
      from_msg_00 = (MessageLite *)from_msg[1]._internal_metadata_.ptr_;
      if (from_msg_00 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_nested_message_ != nullptr";
        line = 0x67ad;
        goto LAB_009c1338;
      }
      to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 8);
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar2 = google::protobuf::Arena::
                 CopyConstruct<edition_unittest::TestNestedMessageHasBits_NestedMessage>
                           (arena,from_msg_00);
        *(void **)((long)&local_30->field_0 + 8) = pvVar2;
      }
      else {
        TestNestedMessageHasBits_NestedMessage::MergeImpl(to_msg_00,from_msg_00);
      }
    }
    (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_30->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  line = 0x67a7;
LAB_009c1338:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void TestNestedMessageHasBits::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestNestedMessageHasBits*>(&to_msg);
  auto& from = static_cast<const TestNestedMessageHasBits&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestNestedMessageHasBits)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
    if (_this->_impl_.optional_nested_message_ == nullptr) {
      _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
    } else {
      _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}